

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,Level level,string_t *format)

{
  pointer pcVar1;
  char *in_RCX;
  char *in_R8;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_00193380;
  this->m_level = level;
  (this->m_userFormat)._M_dataplus._M_p = (pointer)&(this->m_userFormat).field_2;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_userFormat,pcVar1,pcVar1 + format->_M_string_length);
  (this->m_format)._M_dataplus._M_p = (pointer)&(this->m_format).field_2;
  (this->m_format)._M_string_length = 0;
  (this->m_format).field_2._M_local_buf[0] = '\0';
  (this->m_dateTimeFormat)._M_dataplus._M_p = (pointer)&(this->m_dateTimeFormat).field_2;
  (this->m_dateTimeFormat)._M_string_length = 0;
  (this->m_dateTimeFormat).field_2._M_local_buf[0] = '\0';
  utils::OS::getEnvironmentVariable_abi_cxx11_
            (&this->m_currentUser,(OS *)"USER","user",in_RCX,in_R8);
  utils::OS::getEnvironmentVariable_abi_cxx11_
            (&this->m_currentHost,(OS *)"HOSTNAME","unknown-host",in_RCX,in_R8);
  parseFromFormat(this,&this->m_userFormat);
  return;
}

Assistant:

LogFormat::LogFormat(Level level, const base::type::string_t& format)
  : m_level(level), m_userFormat(format), m_currentUser(base::utils::OS::currentUser()),
    m_currentHost(base::utils::OS::currentHost()) {
  parseFromFormat(m_userFormat);
}